

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::map_value_into<double>(double a_value,LOs *a2b,Write<signed_char> *b_data)

{
  Alloc *pAVar1;
  ulong uVar2;
  type_conflict2 functor;
  type_conflict2 local_38;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  Write<double>::Write((Write<double> *)&local_38,(Write<double> *)b_data);
  Write<int>::Write(&local_38.a2b.write_,&a2b->write_);
  local_38.a_value = a_value;
  parallel_for<Omega_h::map_value_into<double>(double,Omega_h::Read<int>,Omega_h::Write<double>)::_lambda(int)_1_>
            ((LO)(uVar2 >> 2),&local_38,"map_value_into");
  map_value_into<double>(double,Omega_h::Read<int>,Omega_h::Write<double>)::{lambda(int)#1}::~Write
            ((_lambda_int__1_ *)&local_38);
  return;
}

Assistant:

void map_value_into(T a_value, LOs a2b, Write<T> b_data) {
  auto na = a2b.size();
  auto functor = OMEGA_H_LAMBDA(LO a) { b_data[a2b[a]] = a_value; };
  parallel_for("map_value_into", na, std::move(functor));
}